

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswConstr.c
# Opt level: O0

void Ssw_ManRefineByConstrSim(Ssw_Man_t *p)

{
  Vec_Ptr_t *p_00;
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  void *pvVar9;
  Aig_Obj_t *pAVar10;
  Aig_Obj_t *pAVar11;
  int nFrames;
  int RetValue2;
  int RetValue1;
  int iLits;
  int i;
  int f;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Ssw_Man_t *p_local;
  
  iVar3 = Vec_IntSize(p->vInits);
  iVar4 = Saig_ManPiNum(p->pAig);
  iVar5 = Vec_IntSize(p->vInits);
  iVar6 = Saig_ManPiNum(p->pAig);
  if (iVar5 % iVar6 != 0) {
    __assert_fail("Vec_IntSize(p->vInits) % Saig_ManPiNum(p->pAig) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswConstr.c"
                  ,0xfc,"void Ssw_ManRefineByConstrSim(Ssw_Man_t *)");
  }
  for (RetValue1 = 0; iVar5 = Saig_ManRegNum(p->pAig), RetValue1 < iVar5; RetValue1 = RetValue1 + 1)
  {
    p_00 = p->pAig->vCos;
    iVar5 = Saig_ManPoNum(p->pAig);
    pvVar9 = Vec_PtrEntry(p_00,RetValue1 + iVar5);
    *(ulong *)((long)pvVar9 + 0x18) = *(ulong *)((long)pvVar9 + 0x18) & 0xffffffffffffffdf;
  }
  RetValue2 = 0;
  for (iLits = 0; iLits < iVar3 / iVar4; iLits = iLits + 1) {
    pAVar10 = Aig_ManConst1(p->pAig);
    *(ulong *)&pAVar10->field_0x18 = *(ulong *)&pAVar10->field_0x18 & 0xffffffffffffffdf | 0x20;
    for (RetValue1 = 0; iVar5 = Saig_ManPiNum(p->pAig), RetValue1 < iVar5; RetValue1 = RetValue1 + 1
        ) {
      pvVar9 = Vec_PtrEntry(p->pAig->vCis,RetValue1);
      uVar8 = Vec_IntEntry(p->vInits,RetValue2);
      *(ulong *)((long)pvVar9 + 0x18) =
           *(ulong *)((long)pvVar9 + 0x18) & 0xffffffffffffffdf | ((ulong)uVar8 & 1) << 5;
      RetValue2 = RetValue2 + 1;
    }
    for (RetValue1 = 0; iVar5 = Saig_ManRegNum(p->pAig), RetValue1 < iVar5;
        RetValue1 = RetValue1 + 1) {
      pAVar10 = Saig_ManLi(p->pAig,RetValue1);
      pAVar11 = Saig_ManLo(p->pAig,RetValue1);
      *(ulong *)&pAVar11->field_0x18 =
           *(ulong *)&pAVar11->field_0x18 & 0xffffffffffffffdf |
           (ulong)((uint)(*(ulong *)&pAVar10->field_0x18 >> 5) & 1) << 5;
    }
    for (RetValue1 = 0; iVar5 = Vec_PtrSize(p->pAig->vObjs), RetValue1 < iVar5;
        RetValue1 = RetValue1 + 1) {
      pAVar10 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,RetValue1);
      if ((pAVar10 != (Aig_Obj_t *)0x0) && (iVar5 = Aig_ObjIsNode(pAVar10), iVar5 != 0)) {
        pAVar11 = Aig_ObjFanin0(pAVar10);
        uVar2 = *(ulong *)&pAVar11->field_0x18;
        uVar8 = Aig_ObjFaninC0(pAVar10);
        pAVar11 = Aig_ObjFanin1(pAVar10);
        uVar1 = *(ulong *)&pAVar11->field_0x18;
        uVar7 = Aig_ObjFaninC1(pAVar10);
        *(ulong *)&pAVar10->field_0x18 =
             *(ulong *)&pAVar10->field_0x18 & 0xffffffffffffffdf |
             ((ulong)(((uint)(uVar2 >> 5) & 1 ^ uVar8) & ((uint)(uVar1 >> 5) & 1 ^ uVar7)) & 1) << 5
        ;
      }
    }
    for (RetValue1 = 0; iVar5 = Vec_PtrSize(p->pAig->vCos), RetValue1 < iVar5;
        RetValue1 = RetValue1 + 1) {
      pAVar10 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCos,RetValue1);
      pAVar11 = Aig_ObjFanin0(pAVar10);
      uVar2 = *(ulong *)&pAVar11->field_0x18;
      uVar8 = Aig_ObjFaninC0(pAVar10);
      *(ulong *)&pAVar10->field_0x18 =
           *(ulong *)&pAVar10->field_0x18 & 0xffffffffffffffdf |
           ((ulong)((uint)(uVar2 >> 5) & 1 ^ uVar8) & 1) << 5;
    }
    for (RetValue1 = 0; iVar5 = Saig_ManPoNum(p->pAig), RetValue1 < iVar5; RetValue1 = RetValue1 + 1
        ) {
      pvVar9 = Vec_PtrEntry(p->pAig->vCos,RetValue1);
      iVar5 = Saig_ManPoNum(p->pAig);
      iVar6 = Saig_ManConstrNum(p->pAig);
      if (RetValue1 < iVar5 - iVar6) {
        if (((*(ulong *)((long)pvVar9 + 0x18) >> 5 & 1) != 0) &&
           (iVar5 = Saig_ManConstrNum(p->pAig), iVar5 != 0)) {
          Abc_Print(1,"output %d failed in frame %d.\n",(ulong)(uint)RetValue1,(ulong)(uint)iLits);
        }
      }
      else if (((*(ulong *)((long)pvVar9 + 0x18) >> 5 & 1) != 0) &&
              (iVar5 = Saig_ManConstrNum(p->pAig), iVar5 != 0)) {
        Abc_Print(1,"constraint %d failed in frame %d.\n",(ulong)(uint)RetValue1,(ulong)(uint)iLits)
        ;
      }
    }
    if (iLits == 0) {
      for (RetValue1 = 0; iVar5 = Vec_PtrSize(p->pAig->vObjs), RetValue1 < iVar5;
          RetValue1 = RetValue1 + 1) {
        pvVar9 = Vec_PtrEntry(p->pAig->vObjs,RetValue1);
        if (pvVar9 != (void *)0x0) {
          *(ulong *)((long)pvVar9 + 0x18) =
               *(ulong *)((long)pvVar9 + 0x18) & 0xfffffffffffffff7 |
               (ulong)((uint)(*(ulong *)((long)pvVar9 + 0x18) >> 5) & 1) << 3;
        }
      }
    }
    else {
      Ssw_ClassesRefineConst1(p->ppClasses,0);
      Ssw_ClassesRefine(p->ppClasses,0);
    }
  }
  iVar3 = Vec_IntSize(p->vInits);
  if (RetValue2 == iVar3) {
    return;
  }
  __assert_fail("iLits == Vec_IntSize(p->vInits)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswConstr.c"
                ,299,"void Ssw_ManRefineByConstrSim(Ssw_Man_t *)");
}

Assistant:

void Ssw_ManRefineByConstrSim( Ssw_Man_t * p )
{
    Aig_Obj_t * pObj, * pObjLi;
    int f, i, iLits, RetValue1, RetValue2;
    int nFrames = Vec_IntSize(p->vInits) / Saig_ManPiNum(p->pAig);
    assert( Vec_IntSize(p->vInits) % Saig_ManPiNum(p->pAig) == 0 );
    // assign register outputs
    Saig_ManForEachLi( p->pAig, pObj, i )
        pObj->fMarkB = 0;
    // simulate the timeframes
    iLits = 0;
    for ( f = 0; f < nFrames; f++ )
    {
        // set the PI simulation information
        Aig_ManConst1(p->pAig)->fMarkB = 1;
        Saig_ManForEachPi( p->pAig, pObj, i )
            pObj->fMarkB = Vec_IntEntry( p->vInits, iLits++ );
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObj, i )
            pObj->fMarkB = pObjLi->fMarkB;
        // simulate internal nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
            pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) )
                         & ( Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj) );
        // assign the COs
        Aig_ManForEachCo( p->pAig, pObj, i )
            pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) );
        // check the outputs
        Saig_ManForEachPo( p->pAig, pObj, i )
        {
            if ( i < Saig_ManPoNum(p->pAig) - Saig_ManConstrNum(p->pAig) )
            {
                if ( pObj->fMarkB && Saig_ManConstrNum(p->pAig) )
                    Abc_Print( 1, "output %d failed in frame %d.\n", i, f );
            }
            else
            {
                if ( pObj->fMarkB && Saig_ManConstrNum(p->pAig) )
                    Abc_Print( 1, "constraint %d failed in frame %d.\n", i, f );
            }
        }
        // transfer
        if ( f == 0 )
        { // copy markB into phase
            Aig_ManForEachObj( p->pAig, pObj, i )
                pObj->fPhase = pObj->fMarkB;
        }
        else
        { // refine classes
            RetValue1 = Ssw_ClassesRefineConst1( p->ppClasses, 0 );
            RetValue2 = Ssw_ClassesRefine( p->ppClasses, 0 );
        }
    }
    assert( iLits == Vec_IntSize(p->vInits) );
}